

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::GenerateMapEntry
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages)

{
  uint uVar1;
  Type TVar2;
  long lVar3;
  long lVar4;
  MapField *pMVar5;
  bool bVar6;
  int iVar7;
  void *pvVar8;
  long *plVar9;
  void *pvVar10;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *from;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar11;
  void *pvVar12;
  UninterpretedOption *pUVar13;
  Arena *pAVar14;
  int index;
  long lVar15;
  undefined1 *puVar16;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *pRVar17;
  string_view value;
  string_view value_00;
  string entry_name;
  string local_58;
  MapField *local_38;
  
  local_38 = map_field;
  pvVar8 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&messages->super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  plVar9 = (long *)((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  lVar3 = *plVar9;
  lVar4 = plVar9[1];
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_58);
  if (lVar4 != 0) {
    lVar15 = 0;
    do {
      if (*(char *)(lVar3 + lVar15) != '_') {
        std::__cxx11::string::push_back((char)&local_58);
      }
      lVar15 = lVar15 + 1;
    } while (lVar4 != lVar15);
  }
  std::__cxx11::string::append((char *)&local_58);
  *(byte *)&field->field_0 = *(byte *)&field->field_0 | 4;
  pAVar14 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar14 & 1) != 0) {
    pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(field->field_0)._impl_.type_name_,&local_58,pAVar14);
  pMVar5 = local_38;
  *(byte *)((long)pvVar8 + 0x10) = *(byte *)((long)pvVar8 + 0x10) | 1;
  pAVar14 = *(Arena **)((long)pvVar8 + 8);
  if (((ulong)pAVar14 & 1) != 0) {
    pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>((ArenaStringPtr *)((long)pvVar8 + 0xd8),&local_58,pAVar14);
  *(byte *)((long)pvVar8 + 0x10) = *(byte *)((long)pvVar8 + 0x10) | 2;
  pvVar10 = *(void **)((long)pvVar8 + 0xe0);
  if (pvVar10 == (void *)0x0) {
    pAVar14 = *(Arena **)((long)pvVar8 + 8);
    if (((ulong)pAVar14 & 1) != 0) {
      pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
    }
    pvVar10 = Arena::DefaultConstruct<google::protobuf::MessageOptions>(pAVar14);
    *(void **)((long)pvVar8 + 0xe0) = pvVar10;
  }
  *(undefined1 *)((long)pvVar10 + 0x53) = 1;
  *(byte *)((long)pvVar10 + 0x28) = *(byte *)((long)pvVar10 + 0x28) | 0x10;
  pvVar10 = internal::RepeatedPtrFieldBase::AddMessageLite
                      ((RepeatedPtrFieldBase *)((long)pvVar8 + 0x18),
                       Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 1;
  pAVar14 = *(Arena **)((long)pvVar10 + 8);
  if (((ulong)pAVar14 & 1) != 0) {
    pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
  }
  value._M_str = "key";
  value._M_len = 3;
  internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar10 + 0x18),value,pAVar14);
  bVar6 = internal::ValidateEnum(1,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
  if (bVar6) {
    *(undefined4 *)((long)pvVar10 + 0x54) = 1;
    uVar1 = *(uint *)((long)pvVar10 + 0x10);
    *(undefined4 *)((long)pvVar10 + 0x48) = 1;
    *(uint *)((long)pvVar10 + 0x10) = uVar1 | 0x240;
    if ((pMVar5->key_type_name)._M_string_length == 0) {
      TVar2 = pMVar5->key_type;
      bVar6 = internal::ValidateEnum(TVar2,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
      if (!bVar6) goto LAB_00201909;
      *(Type *)((long)pvVar10 + 0x58) = TVar2;
      *(byte *)((long)pvVar10 + 0x11) = *(byte *)((long)pvVar10 + 0x11) | 4;
    }
    else {
      *(uint *)((long)pvVar10 + 0x10) = uVar1 | 0x244;
      pAVar14 = *(Arena **)((long)pvVar10 + 8);
      if (((ulong)pAVar14 & 1) != 0) {
        pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)((long)pvVar10 + 0x28),&pMVar5->key_type_name,pAVar14);
    }
    pvVar8 = internal::RepeatedPtrFieldBase::AddMessageLite
                       ((RepeatedPtrFieldBase *)((long)pvVar8 + 0x18),
                        Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
    *(byte *)((long)pvVar8 + 0x10) = *(byte *)((long)pvVar8 + 0x10) | 1;
    pAVar14 = *(Arena **)((long)pvVar8 + 8);
    if (((ulong)pAVar14 & 1) != 0) {
      pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
    }
    value_00._M_str = "value";
    value_00._M_len = 5;
    internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar8 + 0x18),value_00,pAVar14);
    bVar6 = internal::ValidateEnum(1,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
    if (bVar6) {
      *(undefined4 *)((long)pvVar8 + 0x54) = 1;
      uVar1 = *(uint *)((long)pvVar8 + 0x10);
      *(undefined4 *)((long)pvVar8 + 0x48) = 2;
      *(uint *)((long)pvVar8 + 0x10) = uVar1 | 0x240;
      if ((pMVar5->value_type_name)._M_string_length == 0) {
        TVar2 = pMVar5->value_type;
        bVar6 = internal::ValidateEnum(TVar2,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
        if (!bVar6) {
LAB_00201909:
          __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Type_internal_data_)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                        ,0x3a52,
                        "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                       );
        }
        *(Type *)((long)pvVar8 + 0x58) = TVar2;
        *(byte *)((long)pvVar8 + 0x11) = *(byte *)((long)pvVar8 + 0x11) | 4;
      }
      else {
        *(uint *)((long)pvVar8 + 0x10) = uVar1 | 0x244;
        pAVar14 = *(Arena **)((long)pvVar8 + 8);
        if (((ulong)pAVar14 & 1) != 0) {
          pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)((long)pvVar8 + 0x28),&pMVar5->value_type_name,pAVar14);
      }
      puVar16 = (undefined1 *)(field->field_0)._impl_.options_;
      if ((FieldOptions *)puVar16 == (FieldOptions *)0x0) {
        puVar16 = _FieldOptions_default_instance_;
      }
      if (0 < *(int *)((long)&((FieldOptions *)puVar16)->field_0 + 0x50)) {
        index = 0;
        do {
          from = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                           (&(((FieldOptions *)puVar16)->field_0)._impl_.uninterpreted_option_.
                             super_RepeatedPtrFieldBase,index);
          if (*(int *)((long)&from->field_0 + 0x10) == 1) {
            pRVar17 = &(from->field_0)._impl_.name_;
            pVVar11 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                (&pRVar17->super_RepeatedPtrFieldBase,0);
            iVar7 = std::__cxx11::string::compare
                              ((char *)((ulong)(pVVar11->field_0)._impl_.name_part_.tagged_ptr_.ptr_
                                       & 0xfffffffffffffffc));
            if ((iVar7 == 0) &&
               (pVVar11 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                    (&pRVar17->super_RepeatedPtrFieldBase,0),
               (pVVar11->field_0)._impl_.is_extension_ == false)) {
              if (*(int *)((long)pvVar10 + 0x58) == 9) {
                *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 0x20;
                pvVar12 = *(void **)((long)pvVar10 + 0x40);
                if (pvVar12 == (void *)0x0) {
                  pAVar14 = *(Arena **)((long)pvVar10 + 8);
                  if (((ulong)pAVar14 & 1) != 0) {
                    pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
                  }
                  pvVar12 = Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar14);
                  *(void **)((long)pvVar10 + 0x40) = pvVar12;
                }
                pUVar13 = (UninterpretedOption *)
                          internal::RepeatedPtrFieldBase::AddMessageLite
                                    ((RepeatedPtrFieldBase *)((long)pvVar12 + 0x58),
                                     Arena::DefaultConstruct<google::protobuf::UninterpretedOption>)
                ;
                UninterpretedOption::CopyFrom(pUVar13,from);
              }
              if (*(int *)((long)pvVar8 + 0x58) == 9) {
                *(byte *)((long)pvVar8 + 0x10) = *(byte *)((long)pvVar8 + 0x10) | 0x20;
                pvVar12 = *(void **)((long)pvVar8 + 0x40);
                if (pvVar12 == (void *)0x0) {
                  pAVar14 = *(Arena **)((long)pvVar8 + 8);
                  if (((ulong)pAVar14 & 1) != 0) {
                    pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
                  }
                  pvVar12 = Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar14);
                  *(void **)((long)pvVar8 + 0x40) = pvVar12;
                }
                pUVar13 = (UninterpretedOption *)
                          internal::RepeatedPtrFieldBase::AddMessageLite
                                    ((RepeatedPtrFieldBase *)((long)pvVar12 + 0x58),
                                     Arena::DefaultConstruct<google::protobuf::UninterpretedOption>)
                ;
                UninterpretedOption::CopyFrom(pUVar13,from);
              }
            }
          }
          pRVar17 = &(from->field_0)._impl_.name_;
          pVVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                              (&pRVar17->super_RepeatedPtrFieldBase,0);
          iVar7 = std::__cxx11::string::compare
                            ((char *)((ulong)(pVVar11->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
          if ((iVar7 == 0) &&
             (pVVar11 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                  (&pRVar17->super_RepeatedPtrFieldBase,0),
             (pVVar11->field_0)._impl_.is_extension_ == false)) {
            *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 0x20;
            pvVar12 = *(void **)((long)pvVar10 + 0x40);
            if (pvVar12 == (void *)0x0) {
              pAVar14 = *(Arena **)((long)pvVar10 + 8);
              if (((ulong)pAVar14 & 1) != 0) {
                pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
              }
              pvVar12 = Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar14);
              *(void **)((long)pvVar10 + 0x40) = pvVar12;
            }
            pUVar13 = (UninterpretedOption *)
                      internal::RepeatedPtrFieldBase::AddMessageLite
                                ((RepeatedPtrFieldBase *)((long)pvVar12 + 0x58),
                                 Arena::DefaultConstruct<google::protobuf::UninterpretedOption>);
            UninterpretedOption::CopyFrom(pUVar13,from);
            *(byte *)((long)pvVar8 + 0x10) = *(byte *)((long)pvVar8 + 0x10) | 0x20;
            pvVar12 = *(void **)((long)pvVar8 + 0x40);
            if (pvVar12 == (void *)0x0) {
              pAVar14 = *(Arena **)((long)pvVar8 + 8);
              if (((ulong)pAVar14 & 1) != 0) {
                pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
              }
              pvVar12 = Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar14);
              *(void **)((long)pvVar8 + 0x40) = pvVar12;
            }
            pUVar13 = (UninterpretedOption *)
                      internal::RepeatedPtrFieldBase::AddMessageLite
                                ((RepeatedPtrFieldBase *)((long)pvVar12 + 0x58),
                                 Arena::DefaultConstruct<google::protobuf::UninterpretedOption>);
            UninterpretedOption::CopyFrom(pUVar13,from);
          }
          puVar16 = (undefined1 *)(field->field_0)._impl_.options_;
          if ((FieldOptions *)puVar16 == (FieldOptions *)0x0) {
            puVar16 = _FieldOptions_default_instance_;
          }
          index = index + 1;
        } while (index < *(int *)((long)&((FieldOptions *)puVar16)->field_0 + 0x50));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x3a33,
                "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
               );
}

Assistant:

void Parser::GenerateMapEntry(const MapField& map_field,
                              FieldDescriptorProto* field,
                              RepeatedPtrField<DescriptorProto>* messages) {
  DescriptorProto* entry = messages->Add();
  std::string entry_name = MapEntryName(field->name());
  field->set_type_name(entry_name);
  entry->set_name(entry_name);
  entry->mutable_options()->set_map_entry(true);
  FieldDescriptorProto* key_field = entry->add_field();
  key_field->set_name("key");
  key_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  key_field->set_number(1);
  if (map_field.key_type_name.empty()) {
    key_field->set_type(map_field.key_type);
  } else {
    key_field->set_type_name(map_field.key_type_name);
  }
  FieldDescriptorProto* value_field = entry->add_field();
  value_field->set_name("value");
  value_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  value_field->set_number(2);
  if (map_field.value_type_name.empty()) {
    value_field->set_type(map_field.value_type);
  } else {
    value_field->set_type_name(map_field.value_type_name);
  }
  // Propagate all features to the generated key and value fields. This helps
  // simplify the implementation of code generators and also reflection-based
  // parsing code. Instead of having to implement complex inheritance rules
  // special-casing maps, we can just copy them at generation time.
  //
  // The following definition:
  //   message Foo {
  //     map<string, string> value = 1 [features.some_feature = VALUE];
  //   }
  // will be interpreted as:
  //   message Foo {
  //     message ValueEntry {
  //       option map_entry = true;
  //       string key = 1 [features.some_feature = VALUE];
  //       string value = 2 [features.some_feature = VALUE];
  //     }
  //     repeated ValueEntry value = 1 [features.some_feature = VALUE];
  //  }
  for (int i = 0; i < field->options().uninterpreted_option_size(); ++i) {
    const UninterpretedOption& option =
        field->options().uninterpreted_option(i);
    // Legacy handling for the `enforce_utf8` option, which bears a striking
    // similarity to features in many respects.
    // TODO Delete this once proto2/proto3 have been turned down.
    if (option.name_size() == 1 &&
        option.name(0).name_part() == "enforce_utf8" &&
        !option.name(0).is_extension()) {
      if (key_field->type() == FieldDescriptorProto::TYPE_STRING) {
        *key_field->mutable_options()->add_uninterpreted_option() = option;
      }
      if (value_field->type() == FieldDescriptorProto::TYPE_STRING) {
        *value_field->mutable_options()->add_uninterpreted_option() = option;
      }
    }
    if (option.name(0).name_part() == "features" &&
        !option.name(0).is_extension()) {
      *key_field->mutable_options()->add_uninterpreted_option() = option;
      *value_field->mutable_options()->add_uninterpreted_option() = option;
    }
  }
}